

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O2

bool __thiscall duckdb::BatchedBufferedData::BufferIsEmpty(BatchedBufferedData *this)

{
  mutex *__mutex;
  _Elt_pointer puVar1;
  _Elt_pointer puVar2;
  
  __mutex = &(this->super_BufferedData).glock;
  ::std::mutex::lock(__mutex);
  puVar1 = (this->read_queue).
           super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  puVar2 = (this->read_queue).
           super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return puVar1 == puVar2;
}

Assistant:

bool BatchedBufferedData::BufferIsEmpty() {
	lock_guard<mutex> lock(glock);
	return read_queue.empty();
}